

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O1

void ARKodeButcherTable_Space(ARKodeButcherTable B,sunindextype *liw,sunindextype *lrw)

{
  *liw = 0;
  *lrw = 0;
  if (B != (ARKodeButcherTable)0x0) {
    *liw = 3;
    *lrw = ((3 - (uint)(B->d == (realtype *)0x0)) + B->stages) * B->stages;
  }
  return;
}

Assistant:

void ARKodeButcherTable_Space(ARKodeButcherTable B, sunindextype *liw,
                              sunindextype *lrw)
{
  /* initialize outputs and return if B is not allocated */
  *liw = 0;  *lrw = 0;
  if (B == NULL)  return;

  /* fill outputs based on B */
  *liw = 3;
  if (B->d != NULL) {
    *lrw = B->stages * (B->stages + 3);
  } else {
    *lrw = B->stages * (B->stages + 2);
  }
}